

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile_unix.cpp
# Opt level: O3

bool QLockFilePrivate::isProcessRunning(qint64 pid,QString *appname)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView lhs;
  QFileInfo fi;
  QString local_68;
  QFileInfo local_50;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = kill((__pid_t)pid,0);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 == 3) {
      bVar1 = false;
      goto LAB_003be989;
    }
  }
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  processNameByPid(&local_48,pid);
  if ((undefined1 *)local_48.d.size == (undefined1 *)0x0) {
LAB_003be964:
    bVar1 = true;
  }
  else {
    local_50.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(&local_50,appname);
    bVar1 = QFileInfo::isSymLink(&local_50);
    if (bVar1) {
      QFileInfo::symLinkTarget(&local_68,&local_50);
      QFileInfo::setFile(&local_50,&local_68);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QFileInfo::fileName(&local_68,&local_50);
    bVar1 = true;
    if (local_48.d.size == local_68.d.size) {
      rhs.m_data = local_68.d.ptr;
      rhs.m_size = local_48.d.size;
      lhs.m_data = local_48.d.ptr;
      lhs.m_size = local_48.d.size;
      bVar1 = QtPrivate::equalStrings(lhs,rhs);
      bVar1 = !bVar1;
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    QFileInfo::~QFileInfo(&local_50);
    if (!bVar1) goto LAB_003be964;
    bVar1 = false;
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_003be989:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QLockFilePrivate::isProcessRunning(qint64 pid, const QString &appname)
{
    if (::kill(pid_t(pid), 0) == -1 && errno == ESRCH)
        return false; // PID doesn't exist anymore

    const QString processName = processNameByPid(pid);
    if (!processName.isEmpty()) {
        QFileInfo fi(appname);
        if (fi.isSymLink())
            fi.setFile(fi.symLinkTarget());
        if (processName != fi.fileName())
            return false;   // PID got reused by a different application.
    }

    return true;
}